

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void kj::ArrayDisposer::Dispose_<kj::Array<capnp::Orphan<capnp::compiler::Token>_>,_false>::destruct
               (void *ptr)

{
  long lVar1;
  undefined8 uVar2;
  
  lVar1 = *ptr;
  if (lVar1 != 0) {
    uVar2 = *(undefined8 *)((long)ptr + 8);
    *(undefined8 *)ptr = 0;
    *(undefined8 *)((long)ptr + 8) = 0;
    (**(code **)**(undefined8 **)((long)ptr + 0x10))
              (*(undefined8 **)((long)ptr + 0x10),lVar1,0x20,uVar2,uVar2,
               Dispose_<capnp::Orphan<capnp::compiler::Token>,_false>::destruct);
  }
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }